

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::Compare<float>
          (ClearTest *this,GLfloat *data,GLfloat *reference,GLsizei count)

{
  float fVar1;
  int local_30;
  GLsizei i;
  GLsizei count_local;
  GLfloat *reference_local;
  GLfloat *data_local;
  ClearTest *this_local;
  
  local_30 = 0;
  while( true ) {
    if (count <= local_30) {
      return true;
    }
    fVar1 = de::abs<float>(data[local_30] - reference[local_30]);
    if (1e-05 < fVar1) break;
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool ClearTest::Compare<glw::GLfloat>(const glw::GLfloat* data, const glw::GLfloat* reference, const glw::GLsizei count)
{
	for (glw::GLsizei i = 0; i < count; ++i)
	{
		if (de::abs(data[i] - reference[i]) > 0.00001 /* Precision. */)
		{
			return false;
		}
	}
	return true;
}